

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O2

double __thiscall slang::TimeScale::apply(TimeScale *this,double value,TimeUnit unit)

{
  ulong uVar1;
  undefined7 in_register_00000031;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  uVar1 = (ulong)(this->base).unit;
  auVar4._0_8_ = (double)(this->base).magnitude;
  auVar4._8_8_ = (double)(this->precision).magnitude;
  auVar3._8_8_ = apply::scales[(uVar1 - (this->precision).unit) + 5] * auVar4._0_8_;
  auVar3._0_8_ = apply::scales[((CONCAT71(in_register_00000031,unit) & 0xffffffff) - uVar1) + 5];
  auVar4 = divpd(auVar3,auVar4);
  dVar2 = round(value * auVar4._0_8_ * auVar4._8_8_);
  return dVar2 / auVar4._8_8_;
}

Assistant:

double TimeScale::apply(double value, TimeUnit unit) const {
    // First scale the value by the difference between our base and the provided unit.
    // TimeUnits are from 0-5, so we need 11 entries.
    static constexpr double scales[] = {1e15, 1e12, 1e9,  1e6,   1e3,  1e0,
                                        1e-3, 1e-6, 1e-9, 1e-12, 1e-15};
    int diff = int(unit) - int(base.unit);
    double scale = scales[diff + int(TimeUnit::Femtoseconds)] / int(base.magnitude);
    value *= scale;

    // Round the result to the number of decimals implied by the magnitude
    // difference between our base and our precision.
    diff = int(base.unit) - int(precision.unit);
    scale = scales[diff + int(TimeUnit::Femtoseconds)] * int(base.magnitude);
    scale /= int(precision.magnitude);
    value = std::round(value * scale) / scale;

    return value;
}